

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O1

void bitrv2(int n,int *ip,double *a)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  
  *ip = 0;
  if (n < 9) {
    uVar10 = 8;
    uVar11 = 1;
  }
  else {
    uVar5 = 1;
    do {
      n = (uint)n >> 1;
      if (0 < (int)uVar5) {
        uVar11 = 0;
        do {
          ip[uVar5 + uVar11] = ip[uVar11] + n;
          uVar11 = uVar11 + 1;
        } while (uVar5 != uVar11);
      }
      uVar11 = (ulong)(uVar5 * 2);
      uVar10 = uVar5 * 0x10;
      uVar5 = uVar5 * 2;
    } while ((int)uVar10 < n);
  }
  iVar9 = (int)uVar11;
  uVar5 = iVar9 * 2;
  uVar6 = (ulong)uVar5;
  if (uVar10 == n) {
    if (0 < iVar9) {
      lVar12 = 0;
      uVar7 = 0;
      do {
        if (uVar7 != 0) {
          iVar8 = ip[uVar7];
          lVar13 = 0;
          do {
            lVar16 = (long)*(int *)((long)ip + lVar13) + (long)((int)uVar7 * 2);
            pdVar1 = (double *)((long)a + lVar13 * 4 + (long)iVar8 * 8);
            dVar2 = *pdVar1;
            dVar3 = pdVar1[1];
            dVar4 = (a + lVar16)[1];
            *pdVar1 = a[lVar16];
            pdVar1[1] = dVar4;
            a[lVar16] = dVar2;
            (a + lVar16)[1] = dVar3;
            iVar15 = (int)lVar16 + iVar9 * 4;
            dVar2 = pdVar1[uVar6];
            dVar3 = (pdVar1 + uVar6)[1];
            dVar4 = (a + iVar15)[1];
            pdVar1[uVar6] = a[iVar15];
            (pdVar1 + uVar6)[1] = dVar4;
            a[iVar15] = dVar2;
            (a + iVar15)[1] = dVar3;
            iVar15 = iVar15 + iVar9 * -2;
            dVar2 = pdVar1[uVar6 * 2];
            dVar3 = (pdVar1 + uVar6 * 2)[1];
            dVar4 = (a + iVar15)[1];
            pdVar1[uVar6 * 2] = a[iVar15];
            (pdVar1 + uVar6 * 2)[1] = dVar4;
            a[iVar15] = dVar2;
            (a + iVar15)[1] = dVar3;
            iVar15 = iVar15 + iVar9 * 4;
            dVar2 = pdVar1[uVar6 * 3];
            dVar3 = (pdVar1 + uVar6 * 3)[1];
            dVar4 = (a + iVar15)[1];
            pdVar1[uVar6 * 3] = a[iVar15];
            (pdVar1 + uVar6 * 3)[1] = dVar4;
            a[iVar15] = dVar2;
            (a + iVar15)[1] = dVar3;
            lVar13 = lVar13 + 4;
          } while (lVar12 != lVar13);
        }
        lVar13 = (long)((iVar9 + (int)uVar7) * 2) + (long)ip[uVar7];
        iVar8 = (int)lVar13 + uVar5;
        dVar2 = a[lVar13];
        dVar3 = (a + lVar13)[1];
        dVar4 = (a + iVar8)[1];
        a[lVar13] = a[iVar8];
        (a + lVar13)[1] = dVar4;
        a[iVar8] = dVar2;
        (a + iVar8)[1] = dVar3;
        uVar7 = uVar7 + 1;
        lVar12 = lVar12 + 4;
      } while (uVar7 != uVar11);
    }
  }
  else if (1 < iVar9) {
    uVar7 = 1;
    lVar12 = 4;
    do {
      lVar16 = (long)ip[uVar7] * 8 + uVar6 * 8 + 8;
      lVar13 = (long)ip[uVar7] * 8;
      lVar17 = 0;
      do {
        lVar14 = (long)*(int *)((long)ip + lVar17) + (long)((int)uVar7 * 2);
        pdVar1 = (double *)((long)a + lVar17 * 4 + lVar13);
        dVar2 = *pdVar1;
        dVar3 = pdVar1[1];
        dVar4 = (a + lVar14)[1];
        pdVar1 = (double *)((long)a + lVar17 * 4 + lVar13);
        *pdVar1 = a[lVar14];
        pdVar1[1] = dVar4;
        a[lVar14] = dVar2;
        (a + lVar14)[1] = dVar3;
        iVar9 = (int)lVar14 + uVar5;
        pdVar1 = (double *)((long)a + lVar17 * 4 + lVar16 + -8);
        dVar2 = *pdVar1;
        dVar3 = pdVar1[1];
        dVar4 = (a + iVar9)[1];
        pdVar1 = (double *)((long)a + lVar17 * 4 + lVar16 + -8);
        *pdVar1 = a[iVar9];
        pdVar1[1] = dVar4;
        a[iVar9] = dVar2;
        (a + iVar9)[1] = dVar3;
        lVar17 = lVar17 + 4;
      } while (lVar12 != lVar17);
      uVar7 = uVar7 + 1;
      lVar12 = lVar12 + 4;
    } while (uVar7 != uVar11);
  }
  return;
}

Assistant:

void bitrv2(int n, int *ip, double *a)
{
    int j, j1, k, k1, l, m, m2;
    double xr, xi, yr, yi;
    
    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            j1 = 2 * k + m2 + ip[k];
            k1 = j1 + m2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
        }
    }
}